

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::EytzingerLayoutSorter::Sort
          (EytzingerLayoutSorter *this,size_t output_index)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  reference puVar4;
  size_t output_index_local;
  EytzingerLayoutSorter *this_local;
  
  sVar2 = absl::lts_20250127::Span<const_int>::size(&this->input);
  if (output_index < sVar2) {
    Sort(this,output_index * 2 + 1);
    sVar2 = this->i;
    this->i = sVar2 + 1;
    puVar3 = (uint *)absl::lts_20250127::Span<const_int>::operator[](&this->input,sVar2);
    uVar1 = *puVar3;
    puVar4 = absl::lts_20250127::Span<unsigned_int>::operator[](&this->output,output_index);
    *puVar4 = uVar1;
    Sort(this,output_index * 2 + 2);
  }
  return;
}

Assistant:

void Sort(size_t output_index = 0) {
    if (output_index < input.size()) {
      Sort(2 * output_index + 1);
      output[output_index] = input[i++];
      Sort(2 * output_index + 2);
    }
  }